

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  int iVar1;
  bool bVar2;
  int local_58;
  int local_54;
  int len_1;
  int len;
  uchar *comp;
  int r;
  int c;
  int x;
  float linear [3];
  uchar rgbe [4];
  uchar scanlineheader [4];
  float *scanline_local;
  uchar *scratch_local;
  int ncomp_local;
  int width_local;
  stbi__write_context *s_local;
  
  linear[2] = (float)CONCAT13((char)width,CONCAT12((char)((uint)width >> 8),0x202));
  if ((width < 8) || (0x7fff < width)) {
    for (r = 0; r < width; r = r + 1) {
      if (ncomp == 3 || ncomp == 4) {
        linear[0] = scanline[r * ncomp + 2];
        x = (int)scanline[r * ncomp + 1];
        c = (int)scanline[r * ncomp];
      }
      else {
        c = (int)scanline[r * ncomp];
        x = c;
        linear[0] = (float)c;
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),(float *)&c);
      (*s->func)(s->context,linear + 1,4);
    }
  }
  else {
    for (r = 0; r < width; r = r + 1) {
      if (ncomp == 3 || ncomp == 4) {
        linear[0] = scanline[r * ncomp + 2];
        x = (int)scanline[r * ncomp + 1];
        c = (int)scanline[r * ncomp];
      }
      else {
        c = (int)scanline[r * ncomp];
        x = c;
        linear[0] = (float)c;
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),(float *)&c);
      scratch[r] = linear[1]._0_1_;
      scratch[r + width] = linear[1]._1_1_;
      scratch[r + width * 2] = linear[1]._2_1_;
      scratch[r + width * 3] = linear[1]._3_1_;
    }
    (*s->func)(s->context,linear + 2,4);
    for (comp._4_4_ = 0; comp._4_4_ < 4; comp._4_4_ = comp._4_4_ + 1) {
      iVar1 = width * comp._4_4_;
      r = 0;
      while (r < width) {
        comp._0_4_ = r;
        while (((int)comp + 2 < width &&
               ((scratch[(long)(int)comp + (long)iVar1] !=
                 scratch[(long)((int)comp + 1) + (long)iVar1] ||
                (scratch[(long)(int)comp + (long)iVar1] !=
                 scratch[(long)((int)comp + 2) + (long)iVar1]))))) {
          comp._0_4_ = (int)comp + 1;
        }
        if (width <= (int)comp + 2) {
          comp._0_4_ = width;
        }
        for (; r < (int)comp; r = local_54 + r) {
          local_54 = (int)comp - r;
          if (0x80 < local_54) {
            local_54 = 0x80;
          }
          stbiw__write_dump_data(s,local_54,scratch + (long)r + (long)iVar1);
        }
        if ((int)comp + 2 < width) {
          while( true ) {
            bVar2 = false;
            if ((int)comp < width) {
              bVar2 = scratch[(long)(int)comp + (long)iVar1] == scratch[(long)r + (long)iVar1];
            }
            if (!bVar2) break;
            comp._0_4_ = (int)comp + 1;
          }
          for (; r < (int)comp; r = local_58 + r) {
            local_58 = (int)comp - r;
            if (0x7f < local_58) {
              local_58 = 0x7f;
            }
            stbiw__write_run_data(s,local_58,scratch[(long)r + (long)iVar1]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp, unsigned char *scratch, float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         s->func(s->context, rgbe, 4);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      s->func(s->context, scanlineheader, 4);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(s, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(s, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}